

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.cpp
# Opt level: O0

BufferHandle * __thiscall
duckdb::ZSTDCompressionState::GetExtraPageBuffer
          (ZSTDCompressionState *this,block_id_t current_block_id)

{
  bool bVar1;
  BufferHandle *pBVar2;
  BufferHandle *in_RDI;
  bool previous_page_is_segment;
  bool already_separated;
  optional_ptr<duckdb::BufferHandle,_true> to_use;
  BufferManager *buffer_manager;
  BlockManager *block_manager;
  BufferHandle *in_stack_ffffffffffffff60;
  optional_ptr<duckdb::FileBuffer,_true> *local_98;
  block_id_t in_stack_ffffffffffffff70;
  ZSTDCompressionState *in_stack_ffffffffffffff80;
  undefined1 local_70 [24];
  optional_ptr<duckdb::BufferHandle,_true> local_58;
  optional_ptr<duckdb::BufferHandle,_true> local_50;
  undefined1 local_41;
  optional_ptr<duckdb::BufferHandle,_true> local_40;
  optional_ptr<duckdb::BufferHandle,_true> local_38;
  undefined1 local_29;
  optional_ptr<duckdb::BufferHandle,_true> local_28;
  BufferManager *local_20;
  BlockManager *local_18;
  
  local_18 = PartialBlockManager::GetBlockManager
                       ((PartialBlockManager *)
                        in_RDI[1].handle.internal.
                        super___shared_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount._M_pi);
  local_20 = local_18->buffer_manager;
  optional_ptr<duckdb::BufferHandle,_true>::optional_ptr(&local_28);
  if (((ulong)in_RDI[0xb].handle.internal.
              super___shared_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>._M_ptr & 1) == 0)
  {
    in_stack_ffffffffffffff60 = in_RDI + 7;
    optional_ptr<duckdb::BufferHandle,_true>::optional_ptr
              (&local_50,(BufferHandle *)&in_RDI[3].node);
    local_41 = optional_ptr<duckdb::BufferHandle,_true>::operator==
                         ((optional_ptr<duckdb::BufferHandle,_true> *)in_stack_ffffffffffffff60,
                          &local_50);
    if ((bool)local_41) {
      optional_ptr<duckdb::BufferHandle,_true>::optional_ptr
                (&local_58,(BufferHandle *)&in_RDI[4].node);
      local_28.ptr = local_58.ptr;
    }
    else {
      optional_ptr<duckdb::BufferHandle,_true>::operator*
                ((optional_ptr<duckdb::BufferHandle,_true> *)in_stack_ffffffffffffff60);
      FlushPage(in_stack_ffffffffffffff80,in_RDI,in_stack_ffffffffffffff70);
      local_28.ptr = (BufferHandle *)
                     in_RDI[7].handle.internal.
                     super___shared_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    }
  }
  else {
    local_29 = optional_ptr<duckdb::BufferHandle,_true>::operator!=
                         ((optional_ptr<duckdb::BufferHandle,_true> *)(in_RDI + 7),
                          (optional_ptr<duckdb::BufferHandle,_true> *)
                          &in_RDI[7].handle.internal.
                           super___shared_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>.
                           _M_refcount);
    if ((bool)local_29) {
      optional_ptr<duckdb::BufferHandle,_true>::operator*
                ((optional_ptr<duckdb::BufferHandle,_true> *)in_stack_ffffffffffffff60);
      FlushPage(in_stack_ffffffffffffff80,in_RDI,in_stack_ffffffffffffff70);
      local_28.ptr = (BufferHandle *)
                     in_RDI[7].handle.internal.
                     super___shared_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    }
    else {
      pBVar2 = in_RDI + 7;
      optional_ptr<duckdb::BufferHandle,_true>::optional_ptr
                (&local_40,(BufferHandle *)&in_RDI[4].node);
      bVar1 = optional_ptr<duckdb::BufferHandle,_true>::operator==
                        ((optional_ptr<duckdb::BufferHandle,_true> *)pBVar2,&local_40);
      if (bVar1) {
        pBVar2 = in_RDI + 5;
      }
      else {
        pBVar2 = in_RDI + 4;
      }
      local_98 = &pBVar2->node;
      optional_ptr<duckdb::BufferHandle,_true>::optional_ptr(&local_38,(BufferHandle *)local_98);
      local_28.ptr = local_38.ptr;
    }
  }
  optional_ptr<duckdb::BufferHandle,_true>::operator->
            ((optional_ptr<duckdb::BufferHandle,_true> *)in_stack_ffffffffffffff60);
  bVar1 = BufferHandle::IsValid(in_stack_ffffffffffffff60);
  if (!bVar1) {
    (*local_20->_vptr_BufferManager[5])(local_70,local_20,8,local_18,1);
    pBVar2 = optional_ptr<duckdb::BufferHandle,_true>::operator*
                       ((optional_ptr<duckdb::BufferHandle,_true> *)in_stack_ffffffffffffff60);
    BufferHandle::operator=(in_stack_ffffffffffffff60,pBVar2);
    BufferHandle::~BufferHandle(in_stack_ffffffffffffff60);
  }
  pBVar2 = optional_ptr<duckdb::BufferHandle,_true>::operator*
                     ((optional_ptr<duckdb::BufferHandle,_true> *)in_stack_ffffffffffffff60);
  return pBVar2;
}

Assistant:

BufferHandle &GetExtraPageBuffer(block_id_t current_block_id) {
		auto &block_manager = partial_block_manager.GetBlockManager();
		auto &buffer_manager = block_manager.buffer_manager;

		optional_ptr<BufferHandle> to_use;

		if (in_vector) {
			// Currently in a Vector, we have to be mindful of the buffer that the string_lengths lives on
			// as that will have to stay writable until the Vector is finished
			bool already_separated = current_buffer != vector_lengths_buffer;
			if (already_separated) {
				// Already separated, can keep using the other buffer (flush it first)
				FlushPage(*current_buffer, current_block_id);
				to_use = current_buffer;
			} else {
				// Not already separated, have to use the other page
				to_use = current_buffer == &extra_pages[0] ? &extra_pages[1] : &extra_pages[0];
			}
		} else {
			// Start of a new Vector, the string_lengths did not fit on the previous page
			bool previous_page_is_segment = current_buffer == &segment_handle;
			if (!previous_page_is_segment) {
				// We're asking for a fresh buffer to start the vectors data
				// that means the previous vector is finished - so we can flush the current page and reuse it
				D_ASSERT(current_block_id != INVALID_BLOCK);
				FlushPage(*current_buffer, current_block_id);
				to_use = current_buffer;
			} else {
				// Previous buffer was the segment, take the first extra page in this case
				to_use = &extra_pages[0];
			}
		}

		if (!to_use->IsValid()) {
			*to_use = buffer_manager.Allocate(MemoryTag::OVERFLOW_STRINGS, &block_manager);
		}
		return *to_use;
	}